

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

void ZSTD_ldm_gear_reset(ldmRollingHashState_t *state,BYTE *data,size_t minMatchLength)

{
  undefined8 local_30;
  size_t n;
  U64 hash;
  size_t minMatchLength_local;
  BYTE *data_local;
  ldmRollingHashState_t *state_local;
  
  for (local_30 = 0; local_30 + 3 < minMatchLength; local_30 = local_30 + 4) {
  }
  for (; local_30 < minMatchLength; local_30 = local_30 + 1) {
  }
  return;
}

Assistant:

static void ZSTD_ldm_gear_reset(ldmRollingHashState_t* state,
                                BYTE const* data, size_t minMatchLength)
{
    U64 hash = state->rolling;
    size_t n = 0;

#define GEAR_ITER_ONCE() do {                                  \
        hash = (hash << 1) + ZSTD_ldm_gearTab[data[n] & 0xff]; \
        n += 1;                                                \
    } while (0)
    while (n + 3 < minMatchLength) {
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
    }
    while (n < minMatchLength) {
        GEAR_ITER_ONCE();
    }
#undef GEAR_ITER_ONCE
}